

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateCompressedTextureGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  bool bVar1;
  Enum<int,_2UL> EVar2;
  GLenum local_1b4;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  TextureLevelSpec level;
  TextureGenerationSpec texGen_1;
  GetNameFunc local_c0;
  int local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  TextureGenerationSpec texGen;
  GLenum queryTarget;
  GLenum target_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *group_local;
  
  local_1b4 = target;
  if (target == 0x8513) {
    local_1b4 = 0x8518;
  }
  texGen.description.field_2._8_4_ = local_1b4;
  texGen.description.field_2._12_4_ = target;
  TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)local_70);
  local_70._0_4_ = texGen.description.field_2._12_4_;
  local_70._4_4_ = texGen.description.field_2._8_4_;
  texGen.bindTarget._0_1_ = 1;
  EVar2 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
  texGen_1.description.field_2._8_8_ = EVar2.m_getName;
  local_b8 = EVar2.m_value;
  local_c0 = (GetNameFunc)texGen_1.description.field_2._8_8_;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_c0);
  std::operator+(&local_90,&local_b0,", initial values");
  std::__cxx11::string::operator=
            ((string *)
             &texGen.levels.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_70);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_70);
  bVar1 = isCompressionSupportedForTarget(texGen.description.field_2._12_4_);
  if (bVar1) {
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_150);
    level.internalFormat = texGen.description.field_2._12_4_;
    level._20_4_ = texGen.description.field_2._8_4_;
    texGen_1.bindTarget._0_1_ = 0;
    EVar2 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
    local_1a0 = EVar2.m_getName;
    local_198 = EVar2.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_190,&local_1a0);
    std::operator+(&local_170,&local_190,", compressed");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_1.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    local_150._0_4_ = 0x20;
    local_150._4_4_ = 0x20;
    level.width = (texGen.description.field_2._12_4_ == 0x8c1a) + 1;
    level.height = 0;
    level.depth = 0x9274;
    level.level._0_1_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_1.bindWholeArray,(value_type *)local_150);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
  }
  return;
}

Assistant:

static void generateCompressedTextureGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget	= target;
		texGen.queryTarget	= queryTarget;
		texGen.immutable	= true;
		texGen.description	= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// compressed
	if (isCompressionSupportedForTarget(target))
	{
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= false;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", compressed";

		level.width				= 32;
		level.height			= 32;
		level.depth				= (target == GL_TEXTURE_2D_ARRAY) ? (2) : (1);
		level.level				= 0;
		level.internalFormat	= GL_COMPRESSED_RGB8_ETC2;
		level.compressed		= true;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}
}